

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  BYTE *iEnd;
  uint uVar1;
  int iVar2;
  int *piVar3;
  U32 UVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  BYTE *pBVar10;
  uint uVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  ulong uVar14;
  size_t sVar15;
  int *ip;
  int *piVar16;
  int *piVar17;
  int iVar18;
  int iVar19;
  size_t offsetFound;
  U32 local_c0;
  U32 local_bc;
  size_t local_a0;
  BYTE *local_98;
  BYTE *local_90;
  BYTE *local_88;
  BYTE *local_80;
  ulong local_78;
  int *local_70;
  ZSTD_matchState_t *local_68;
  ZSTD_compressionParameters *local_60;
  int local_54;
  seqStore_t *local_50;
  int *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  local_70 = (int *)((long)src + (srcSize - 8));
  local_98 = (ms->window).base;
  local_88 = (ms->window).dictBase;
  uVar1 = (ms->window).dictLimit;
  local_78 = (ulong)(ms->window).lowLimit;
  local_80 = local_88 + uVar1;
  local_bc = *rep;
  local_c0 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_40 = local_88 + local_78;
  local_90 = local_98 + uVar1;
  ip = (int *)((ulong)(local_90 == (BYTE *)src) + (long)src);
  iVar5 = uVar1 - 1;
  local_68 = ms;
  local_60 = cParams;
  local_50 = seqStore;
  piVar3 = (int *)src;
  local_38 = rep;
  do {
    while( true ) {
      local_48 = piVar3;
      if (local_70 <= ip) {
        *local_38 = local_bc;
        local_38[1] = local_c0;
        return (long)iEnd - (long)local_48;
      }
      iVar18 = (int)ip - (int)local_98;
      uVar6 = (iVar18 - local_bc) + 1;
      pBVar10 = local_88;
      if (uVar1 <= uVar6) {
        pBVar10 = local_98;
      }
      if (((uint)local_78 < uVar6 && 2 < iVar5 - uVar6) &&
         (*(int *)((long)ip + 1) == *(int *)(pBVar10 + uVar6))) {
        pBVar13 = local_80;
        if (uVar1 <= uVar6) {
          pBVar13 = iEnd;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar10 + uVar6) + 4),iEnd,pBVar13
                           ,local_90);
        uVar14 = sVar7 + 4;
      }
      else {
        uVar14 = 0;
      }
      local_a0 = 99999999;
      sVar7 = ZSTD_BtFindBestMatch_selectMLS_extDict(local_68,local_60,(BYTE *)ip,iEnd,&local_a0);
      uVar9 = uVar14;
      if (uVar14 < sVar7) {
        uVar9 = sVar7;
      }
      if (3 < uVar9) break;
      ip = (int *)((long)ip + ((long)ip - (long)local_48 >> 8) + 1);
      piVar3 = local_48;
    }
    sVar8 = local_a0;
    piVar3 = ip;
    if (sVar7 <= uVar14) {
      sVar8 = 0;
      piVar3 = (int *)((long)ip + 1);
    }
LAB_0018fc7e:
    do {
      iVar19 = iVar18;
      sVar7 = uVar9;
      piVar17 = piVar3;
      piVar16 = ip;
      sVar15 = sVar8;
      if (local_70 <= piVar16) break;
      ip = (int *)((long)piVar16 + 1);
      local_54 = iVar19 + 1;
      if (sVar15 == 0) {
        sVar15 = 0;
      }
      else {
        uVar6 = local_54 - local_bc;
        pBVar10 = local_98;
        if (uVar6 < uVar1) {
          pBVar10 = local_88;
        }
        if (((uint)local_78 < uVar6 && 2 < iVar5 - uVar6) && (*ip == *(int *)(pBVar10 + uVar6))) {
          pBVar13 = iEnd;
          if (uVar6 < uVar1) {
            pBVar13 = local_80;
          }
          sVar8 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar16 + 5),(BYTE *)((long)(pBVar10 + uVar6) + 4),iEnd,
                             pBVar13,local_90);
          if (sVar8 < 0xfffffffffffffffc) {
            uVar11 = (int)sVar15 + 1;
            uVar6 = 0x1f;
            if (uVar11 != 0) {
              for (; uVar11 >> uVar6 == 0; uVar6 = uVar6 - 1) {
              }
            }
            if ((int)((uVar6 ^ 0x1f) + (int)sVar7 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
              sVar15 = 0;
              piVar17 = ip;
              sVar7 = sVar8 + 4;
            }
          }
        }
      }
      local_a0 = 99999999;
      uVar9 = ZSTD_BtFindBestMatch_selectMLS_extDict(local_68,local_60,(BYTE *)ip,iEnd,&local_a0);
      if (3 < uVar9) {
        uVar11 = (int)sVar15 + 1;
        uVar6 = 0x1f;
        if (uVar11 != 0) {
          for (; uVar11 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar11 = (int)local_a0 + 1;
        iVar2 = 0x1f;
        if (uVar11 != 0) {
          for (; uVar11 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        sVar8 = local_a0;
        piVar3 = ip;
        iVar18 = local_54;
        if ((int)((uVar6 ^ 0x1f) + (int)sVar7 * 4 + -0x1b) < (int)uVar9 * 4 - iVar2)
        goto LAB_0018fc7e;
      }
      if (local_70 <= ip) break;
      ip = (int *)((long)piVar16 + 2);
      iVar18 = iVar19 + 2;
      if (sVar15 == 0) {
        sVar15 = 0;
      }
      else {
        uVar6 = iVar18 - local_bc;
        pBVar10 = local_98;
        if (uVar6 < uVar1) {
          pBVar10 = local_88;
        }
        if (((uint)local_78 < uVar6 && 2 < iVar5 - uVar6) && (*ip == *(int *)(pBVar10 + uVar6))) {
          pBVar13 = iEnd;
          if (uVar6 < uVar1) {
            pBVar13 = local_80;
          }
          sVar8 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar16 + 6),(BYTE *)((long)(pBVar10 + uVar6) + 4),iEnd,
                             pBVar13,local_90);
          if (sVar8 < 0xfffffffffffffffc) {
            uVar11 = (int)sVar15 + 1;
            uVar6 = 0x1f;
            if (uVar11 != 0) {
              for (; uVar11 >> uVar6 == 0; uVar6 = uVar6 - 1) {
              }
            }
            if ((int)((uVar6 ^ 0x1f) + (int)sVar7 * 4 + -0x1e) < (int)(sVar8 + 4) * 4) {
              sVar15 = 0;
              piVar17 = ip;
              sVar7 = sVar8 + 4;
            }
          }
        }
      }
      local_a0 = 99999999;
      uVar9 = ZSTD_BtFindBestMatch_selectMLS_extDict(local_68,local_60,(BYTE *)ip,iEnd,&local_a0);
      if (uVar9 < 4) break;
      uVar11 = (int)sVar15 + 1;
      uVar6 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar11 = (int)local_a0 + 1;
      iVar19 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> iVar19 == 0; iVar19 = iVar19 + -1) {
        }
      }
      sVar8 = local_a0;
      piVar3 = ip;
    } while ((int)((uVar6 ^ 0x1f) + (int)sVar7 * 4 + -0x18) < (int)uVar9 * 4 - iVar19);
    if (sVar15 == 0) {
      sVar15 = 0;
    }
    else {
      pBVar12 = (BYTE *)((long)piVar17 + (-(long)local_98 - sVar15) + 2);
      pBVar13 = local_90;
      pBVar10 = local_98;
      if ((uint)pBVar12 < uVar1) {
        pBVar13 = local_40;
        pBVar10 = local_88;
      }
      pBVar10 = pBVar10 + ((ulong)pBVar12 & 0xffffffff);
      for (; ((local_48 < piVar17 && (pBVar13 < pBVar10)) &&
             (*(BYTE *)((long)piVar17 + -1) == pBVar10[-1])); piVar17 = (int *)((long)piVar17 + -1))
      {
        pBVar10 = pBVar10 + -1;
        sVar7 = sVar7 + 1;
      }
      local_c0 = local_bc;
      local_bc = (int)sVar15 - 2;
    }
    ZSTD_storeSeq(local_50,(long)piVar17 - (long)local_48,local_48,(U32)sVar15,sVar7 - 3);
    UVar4 = local_c0;
    for (ip = (int *)((long)piVar17 + sVar7); local_c0 = UVar4, piVar3 = ip, ip <= local_70;
        ip = (int *)((long)ip + sVar7 + 4)) {
      uVar6 = (uint)((long)ip - (long)(local_98 + local_c0));
      pBVar10 = local_98;
      if (uVar6 < uVar1) {
        pBVar10 = local_88;
      }
      if (((uVar6 <= (uint)local_78) || (iVar5 - uVar6 < 3)) ||
         (*ip != *(int *)(pBVar10 + ((long)ip - (long)(local_98 + local_c0) & 0xffffffff)))) break;
      pBVar13 = iEnd;
      if (uVar6 < uVar1) {
        pBVar13 = local_80;
      }
      sVar7 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),
                         (BYTE *)((long)(pBVar10 +
                                        ((long)ip - (long)(local_98 + local_c0) & 0xffffffff)) + 4),
                         iEnd,pBVar13,local_90);
      ZSTD_storeSeq(local_50,0,ip,0,sVar7 + 1);
      UVar4 = local_bc;
      local_bc = local_c0;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, cParams, src, srcSize, 1, 2);
}